

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O2

ecs_entity_t
assign_ptr_w_entity(ecs_world_t *world,ecs_entity_t entity,ecs_entity_t component,size_t size,
                   void *ptr,_Bool is_move,_Bool notify)

{
  ecs_world_t *world_00;
  _Bool _Var1;
  ecs_size_t eVar2;
  ecs_stage_t *stage;
  void *__s;
  ecs_entity_t eVar3;
  ecs_c_info_t *peVar4;
  undefined7 in_register_00000089;
  ecs_move_t p_Var5;
  ecs_world_t *world_local;
  ecs_entity_t component_local;
  ecs_entity_t entity_local;
  undefined4 local_64;
  ecs_entities_t added;
  ecs_entity_info_t info;
  
  local_64 = (undefined4)CONCAT71(in_register_00000089,is_move);
  world_local = world;
  component_local = component;
  entity_local = entity;
  stage = ecs_get_stage(&world_local);
  added.count = 1;
  added.array = &component_local;
  if (entity == 0) {
    entity = ecs_new_id(world_local);
    entity_local = entity;
    if (stage->scope != 0) {
      ecs_add_entity(world_local,entity,stage->scope | 0xfd00000000000000);
    }
  }
  eVar3 = component_local;
  world_00 = world_local;
  eVar2 = ecs_from_size_t(size);
  _Var1 = ecs_defer_set(world_00,stage,EcsOpSet,entity,eVar3,eVar2,ptr,(void **)0x0,(_Bool *)0x0);
  if (_Var1) {
    return entity;
  }
  __s = get_mutable(world_local,entity,component_local,&info,(_Bool *)0x0);
  _ecs_assert(__s != (void *)0x0,0xc,(char *)0x0,"dst != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x87a);
  if (__s == (void *)0x0) {
    __assert_fail("dst != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x87a,
                  "ecs_entity_t assign_ptr_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t, size_t, void *, _Bool, _Bool)"
                 );
  }
  if (ptr == (void *)0x0) {
    memset(__s,0,size);
  }
  else {
    eVar3 = ecs_get_typeid(world_local,component_local);
    peVar4 = get_c_info(world_local,eVar3);
    if (peVar4 != (ecs_c_info_t *)0x0) {
      if ((char)local_64 == '\0') {
        p_Var5 = (peVar4->lifecycle).copy;
      }
      else {
        p_Var5 = (peVar4->lifecycle).move;
      }
      if (p_Var5 != (ecs_move_t)0x0) {
        (*p_Var5)(world_local,eVar3,&entity_local,&entity_local,__s,ptr,size,1,
                  (peVar4->lifecycle).ctx);
        goto LAB_00110aae;
      }
    }
    eVar2 = ecs_from_size_t(size);
    memcpy(__s,ptr,(long)eVar2);
  }
LAB_00110aae:
  ecs_table_mark_dirty(info.table,component_local);
  if (notify) {
    ecs_run_set_systems(world_local,&added,info.table,info.data,info.row,1,false);
  }
  ecs_defer_flush(world_local,stage);
  return entity_local;
}

Assistant:

static
ecs_entity_t assign_ptr_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t component,
    size_t size,
    void * ptr,
    bool is_move,
    bool notify)
{
    ecs_stage_t *stage = ecs_get_stage(&world);

    ecs_entities_t added = {
        .array = &component,
        .count = 1
    };

    if (!entity) {
        entity = ecs_new_id(world);
        ecs_entity_t scope = stage->scope;
        if (scope) {
            ecs_add_entity(world, entity, ECS_CHILDOF | scope);
        }
    }

    if (ecs_defer_set(world, stage, EcsOpSet, entity, component, 
        ecs_from_size_t(size), ptr, NULL, NULL))
    {
        return entity;
    }

    ecs_entity_info_t info;

    void *dst = get_mutable(world, entity, component, &info, NULL);

    /* This can no longer happen since we defer operations */
    ecs_assert(dst != NULL, ECS_INTERNAL_ERROR, NULL);

    if (ptr) {
        ecs_entity_t real_id = ecs_get_typeid(world, component);
        ecs_c_info_t *cdata = get_c_info(world, real_id);
        if (cdata) {
            if (is_move) {
                ecs_move_t move = cdata->lifecycle.move;
                if (move) {
                    move(world, real_id, &entity, &entity, dst, ptr, size, 1, 
                        cdata->lifecycle.ctx);
                } else {
                    ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
                }
            } else {
                ecs_copy_t copy = cdata->lifecycle.copy;
                if (copy) {
                    copy(world, real_id, &entity, &entity, dst, ptr, size, 1, 
                        cdata->lifecycle.ctx);
                } else {
                    ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
                }
            }
        } else {
            ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
        }
    } else {
        memset(dst, 0, size);
    }

    ecs_table_mark_dirty(info.table, component);

    if (notify) {
        ecs_run_set_systems(world, &added, 
            info.table, info.data, info.row, 1, false);
    }

    ecs_defer_flush(world, stage);

    return entity;
}